

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

TimingOf<std::chrono::_V2::system_clock,_std::vector<double>_(*&(int_&))(int)> * __thiscall
nonius::detail::
measure<std::chrono::_V2::system_clock,std::vector<double,std::allocator<double>>(*&)(int),int&>
          (TimingOf<std::chrono::_V2::system_clock,_std::vector<double>_(*&(int_&))(int)>
           *__return_storage_ptr__,detail *this,
          _func_vector<double,_std::allocator<double>_>_int **fun,int *args)

{
  long lVar1;
  long lVar2;
  _Vector_base<double,_std::allocator<double>_> local_58;
  _Vector_base<double,_std::allocator<double>_> local_38;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  (**(code **)this)(&local_38,*(undefined4 *)fun);
  lVar2 = std::chrono::_V2::system_clock::now();
  local_58._M_impl.super__Vector_impl_data._M_start =
       local_38._M_impl.super__Vector_impl_data._M_start;
  local_58._M_impl.super__Vector_impl_data._M_finish =
       local_38._M_impl.super__Vector_impl_data._M_finish;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_38._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->elapsed).__r = lVar2 - lVar1;
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->result,(vector<double,_std::allocator<double>_> *)&local_58);
  __return_storage_ptr__->iterations = 1;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_58);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

TimingOf<Clock, Fun(Args...)> measure(Fun&& fun, Args&&... args) {
            auto start = Clock::now();
            auto&& r = detail::complete_invoke(fun, std::forward<Args>(args)...);
            auto end = Clock::now();
            auto delta = end - start;
            return { delta, std::forward<decltype(r)>(r), 1 };
        }